

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuumEnergyAngle.test.cpp
# Opt level: O2

void verifyChunkWithLANG14(ContinuumEnergyAngle *chunk)

{
  vector<double,_std::allocator<double>_> *this;
  int iVar1;
  long *plVar2;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *pIVar3;
  bool bVar4;
  long lVar5;
  variant_alternative_t<3UL,_variant<LegendreCoefficients,_KalbachMann,_ThermalScatteringData,_TabulatedDistribution>_>
  *pvVar6;
  range_reference_t<D<true>_>_conflict1 pdVar7;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  AssertionHandler catchAssertionHandler_57;
  undefined1 local_190 [8];
  undefined8 local_188;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  double local_168;
  TabulatedDistribution subsection2;
  double local_108;
  undefined1 local_100 [9];
  bool local_f7;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_f0;
  AssertionHandler *local_e8;
  ITransientExpression local_d8;
  double *local_c8;
  WithinRelMatcher *local_c0;
  undefined1 local_b8 [8];
  bool local_b0;
  bool bStack_af;
  undefined2 uStack_ae;
  undefined4 uStack_ac;
  _Head_base<0UL,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_false>
  local_a8;
  AssertionHandler *local_a0;
  unsigned_long local_98;
  undefined8 local_90;
  InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
  *local_88;
  TabulatedDistribution subsection1;
  
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22a;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x10;
  capturedExpression.m_start = "1 == chunk.LAW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName,(SourceLineInfo *)&subsection2,
             capturedExpression,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_2_ = 0x101;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed330;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = 1;
  local_88 = &chunk->data_;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22b;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x10;
  capturedExpression_00.m_start = "2 == chunk.LEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_00,(SourceLineInfo *)&subsection2,
             capturedExpression_00,ContinueOnFailure);
  iVar1 = (int)((_Head_base<3UL,_long,_false> *)
               ((long)&(chunk->data_).interpolation_.super_InterpolationBase.metadata.fields.
                       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                       super__Tuple_impl<1UL,_double,_long,_long,_long,_long> + 0x10))->_M_head_impl
  ;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       iVar1 == 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed330;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl._0_4_ = iVar1;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22c;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "2 == chunk.NE()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_01,(SourceLineInfo *)&subsection2,
             capturedExpression_01,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(*(pointer *)
                           ((long)&(chunk->data_).interpolation_.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data + 8))[-1];
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22d;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x23;
  capturedExpression_02.m_start = "2 == chunk.numberIncidentEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_02,(SourceLineInfo *)&subsection2,
             capturedExpression_02,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(*(pointer *)
                           ((long)&(chunk->data_).interpolation_.super_InterpolationBase.
                                   boundaryIndices.super__Vector_base<long,_std::allocator<long>_>.
                                   _M_impl.super__Vector_impl_data + 8))[-1];
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22e;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0xf;
  capturedExpression_03.m_start = "1 == chunk.NR()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_03,(SourceLineInfo *)&subsection2,
             capturedExpression_03,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x22f;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x27;
  capturedExpression_04.m_start = "1 == chunk.numberInterpolationRegions()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_04,(SourceLineInfo *)&subsection2,
             capturedExpression_04,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x230;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x17;
  capturedExpression_05.m_start = "1 == chunk.INT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_05,(SourceLineInfo *)&subsection2,
             capturedExpression_05,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.
                         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed3b0;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x231;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x17;
  capturedExpression_06.m_start = "1 == chunk.NBT().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_06,(SourceLineInfo *)&subsection2,
             capturedExpression_06,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed3b0;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x232;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x13;
  capturedExpression_07.m_start = "1 == chunk.INT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_07,(SourceLineInfo *)&subsection2,
             capturedExpression_07,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->data_).interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 4.94065645841247e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x233;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x13;
  capturedExpression_08.m_start = "2 == chunk.NBT()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_08,(SourceLineInfo *)&subsection2,
             capturedExpression_08,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x234;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x20;
  capturedExpression_09.m_start = "1 == chunk.interpolants().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_09,(SourceLineInfo *)&subsection2,
             capturedExpression_09,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.
                         interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>.
                         _M_impl.super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.interpolationSchemeIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed3b0;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x235;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1e;
  capturedExpression_10.m_start = "1 == chunk.boundaries().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_10,(SourceLineInfo *)&subsection2,
             capturedExpression_10,ContinueOnFailure);
  lVar5 = (long)*(pointer *)
                 ((long)&(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                         super__Vector_base<long,_std::allocator<long>_>._M_impl.
                         super__Vector_impl_data + 8) -
          (long)(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                _M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)(lVar5 >> 3);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       lVar5 == 8;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed3b0;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x236;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x1c;
  capturedExpression_11.m_start = "1 == chunk.interpolants()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_11,(SourceLineInfo *)&subsection2,
             capturedExpression_11,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->data_).interpolation_.super_InterpolationBase.
                          interpolationSchemeIndices.super__Vector_base<long,_std::allocator<long>_>
                          ._M_impl.super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 4.94065645841247e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)anon_var_dwarf_5d;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl = 0x237;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x1a;
  capturedExpression_12.m_start = "2 == chunk.boundaries()[0]";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection1,macroName_12,(SourceLineInfo *)&subsection2,
             capturedExpression_12,ContinueOnFailure);
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
  _M_head_impl = (double)*(chunk->data_).interpolation_.super_InterpolationBase.boundaryIndices.
                          super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.super__Head_base<1UL,_double,_false>.
       _M_head_impl == 9.88131291682493e-324;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._0_1_ = 1;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>
  ._M_head_impl = (_Head_base<5UL,_long,_false>)&PTR_streamReconstructedExpression_001ed370;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Tuple_impl<4UL,_long,_long>.super__Head_base<4UL,_long,_false>._M_head_impl._4_4_ = 2;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
  super__Head_base<3UL,_long,_false>._M_head_impl = (long)anon_var_dwarf_43048;
  subsection2.super_Base.super_ListRecord.metadata.fields.
  super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
  super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
  super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>._M_head_impl = 2
  ;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection1,(ITransientExpression *)&subsection2);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)&subsection2);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection1);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection1);
  pvVar6 = std::
           get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                     ((chunk->data_).sequence_.
                      super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution::TabulatedDistribution
            (&subsection1,pvVar6);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x23c;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x22;
  capturedExpression_13.m_start = "1e-5, WithinRel( subsection1.E() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_13,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_13,ContinueOnFailure);
  local_b8 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_57,
             subsection1.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_b8);
  local_188._1_1_ = bVar4;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_b8;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x23d;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x2f;
  capturedExpression_14.m_start = "1e-5, WithinRel( subsection1.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_14,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_14,ContinueOnFailure);
  local_b8 = (undefined1  [8])0x3ee4f8b588e368f1;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)&catchAssertionHandler_57,
             subsection1.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  local_188._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_b8);
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_b8;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x23e;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x18;
  capturedExpression_15.m_start = "14 == subsection1.LANG()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_15,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_15,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.lang_ == 0xe,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ed330;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(0xe,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start._4_4_,
                        subsection1.lang_);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x23f;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "14 == subsection1.representation()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_16,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_16,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.lang_ == 0xe,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001ed330;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(0xe,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start._4_4_,
                        subsection1.lang_);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x240;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x15;
  capturedExpression_17.m_start = "0 == subsection1.ND()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_17,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_17,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl == 0,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       catchAssertionHandler_57.m_assertionInfo.macroName.m_size & 0xffffffff;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x241;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x29;
  capturedExpression_18.m_start = "0 == subsection1.numberDiscreteEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_18,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_18,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
                _M_head_impl == 0,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       catchAssertionHandler_57.m_assertionInfo.macroName.m_size & 0xffffffff;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x242;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x15;
  capturedExpression_19.m_start = "4 == subsection1.NA()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_19,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_19,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                _M_head_impl == 4,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x243;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x2a;
  capturedExpression_20.m_start = "4 == subsection1.numberAngularParameters()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_20,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_20,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
                _M_head_impl == 4,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(4,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x244;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x16;
  capturedExpression_21.m_start = "12 == subsection1.NW()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_21,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_21,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)((long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11((long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)subsection1.super_Base.super_ListRecord.data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0x60,1);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(0xc,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x245;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x16;
  capturedExpression_22.m_start = "2 == subsection1.NEP()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_22,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_22,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl == 2,1)
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x246;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x2a;
  capturedExpression_23.m_start = "2 == subsection1.numberSecondaryEnergies()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_23,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_23,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(subsection1.super_Base.super_ListRecord.metadata.fields.
                super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                super__Tuple_impl<2UL,_long,_long,_long,_long>.
                super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl == 2,1)
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "lh\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)subsection1.super_Base.super_ListRecord.metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
               super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x247;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x1c;
  capturedExpression_24.m_start = "2 == subsection1.EP().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_24,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_24,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_190,&subsection1.super_Base);
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)((ulong)((long)local_180._M_current +
                       ((long)*(pointer *)(local_188 + 8) - *(long *)local_188 >> 3) + -1) /
               (ulong)local_180._M_current);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "(i\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x248;
  macroName_25.m_size = 5;
  macroName_25.m_start = "CHECK";
  capturedExpression_25.m_size = 0x22;
  capturedExpression_25.m_start = "2 == subsection1.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_25,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_25,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_190,&subsection1.super_Base);
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)((ulong)((long)local_180._M_current +
                       ((long)*(pointer *)(local_188 + 8) - *(long *)local_188 >> 3) + -1) /
               (ulong)local_180._M_current);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "(i\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x249;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x24;
  capturedExpression_26.m_start = "1., WithinRel( subsection1.EP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_26,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_26,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x3ff0000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  bVar4 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_188._1_1_ = bVar4;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_100;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24a;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x24;
  capturedExpression_27.m_start = "7., WithinRel( subsection1.EP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_27,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_27,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x401c000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_188._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_100;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24b;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x2a;
  capturedExpression_28.m_start = "1., WithinRel( subsection1.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_28,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_28,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x3ff0000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_188._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_100;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24c;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x2a;
  capturedExpression_29.m_start = "7., WithinRel( subsection1.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_29,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_29,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x401c000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_188._1_1_ =
       Catch::Matchers::WithinRelMatcher::match
                 ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_180._M_current = (double *)local_100;
  local_178._M_allocated_capacity = (size_type)&catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24d;
  macroName_30.m_size = 5;
  macroName_30.m_start = "CHECK";
  capturedExpression_30.m_size = 0x1c;
  capturedExpression_30.m_start = "2 == subsection1.F0().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_30,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_30,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)(((((long)local_188 - (long)local_180._M_current >> 3) +
                 local_178._M_allocated_capacity) - 1) / local_178._M_allocated_capacity);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "(i\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24e;
  macroName_31.m_size = 5;
  macroName_31.m_start = "CHECK";
  capturedExpression_31.m_size = 0x34;
  capturedExpression_31.m_start = "2 == subsection1.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_31,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_31,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start =
       (char *)(((((long)local_188 - (long)local_180._M_current >> 3) +
                 local_178._M_allocated_capacity) - 1) / local_178._M_allocated_capacity);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size._0_2_ =
       CONCAT11(catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start == (char *)0x2,1
               );
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start = "(i\x14";
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size =
       CONCAT44(2,(undefined4)catchAssertionHandler_57.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)&catchAssertionHandler_57);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x24f;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x24;
  capturedExpression_32.m_start = "2., WithinRel( subsection1.F0()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_32,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_32,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x4000000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_190,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x250;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x24;
  capturedExpression_33.m_start = "8., WithinRel( subsection1.F0()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_33,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_33,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x4020000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_190,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x251;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x3c;
  capturedExpression_34.m_start = "2., WithinRel( subsection1.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_34,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_34,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x4000000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_190,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x252;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x3c;
  capturedExpression_35.m_start = "8., WithinRel( subsection1.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_35,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_35,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x4020000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_190,&subsection1.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_190,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x253;
  macroName_36.m_size = 5;
  macroName_36.m_start = "CHECK";
  capturedExpression_36.m_size = 0x1c;
  capturedExpression_36.m_start = "2 == subsection1.MU().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_36,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_36,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file =
       (char *)&subsection1.super_Base.super_ListRecord.data;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start = (char *)0x200000000;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_size = 0x200000000;
  local_178._8_8_ =
       ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
       size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x254;
  macroName_37.m_size = 5;
  macroName_37.m_start = "CHECK";
  capturedExpression_37.m_size = 0x21;
  capturedExpression_37.m_start = "2 == subsection1.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_37,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_37,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file =
       (char *)&subsection1.super_Base.super_ListRecord.data;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start = (char *)0x200000000;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_size = 0x200000000;
  local_178._8_8_ =
       ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
       size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x255;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x27;
  capturedExpression_38.m_start = "3., WithinRel( subsection1.MU()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_38,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_38,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4008000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x256;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x27;
  capturedExpression_39.m_start = "5., WithinRel( subsection1.MU()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_39,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_39,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4014000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 599;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x27;
  capturedExpression_40.m_start = "9., WithinRel( subsection1.MU()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_40,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_40,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4022000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 600;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x28;
  capturedExpression_41.m_start = "11., WithinRel( subsection1.MU()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_41,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_41,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4026000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x259;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x2c;
  capturedExpression_42.m_start = "3., WithinRel( subsection1.cosines()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_42,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_42,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4008000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25a;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x2c;
  capturedExpression_43.m_start = "5., WithinRel( subsection1.cosines()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_43,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_43,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4014000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25b;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x2c;
  capturedExpression_44.m_start = "9., WithinRel( subsection1.cosines()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_44,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_44,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4022000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25c;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x2d;
  capturedExpression_45.m_start = "11., WithinRel( subsection1.cosines()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_45,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_45,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4026000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25d;
  macroName_46.m_size = 5;
  macroName_46.m_start = "CHECK";
  capturedExpression_46.m_size = 0x1b;
  capturedExpression_46.m_start = "2 == subsection1.F().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_46,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_46,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file =
       (char *)&subsection1.super_Base.super_ListRecord.data;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start = (char *)0x300000000;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_size = 0x200000000;
  local_178._8_8_ =
       ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
       size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25e;
  macroName_47.m_size = 5;
  macroName_47.m_start = "CHECK";
  capturedExpression_47.m_size = 0x27;
  capturedExpression_47.m_start = "2 == subsection1.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_47,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_47,ContinueOnFailure);
  catchAssertionHandler_57.m_assertionInfo.lineInfo.line =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  catchAssertionHandler_57.m_assertionInfo.lineInfo.file =
       (char *)&subsection1.super_Base.super_ListRecord.data;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_start = (char *)0x300000000;
  catchAssertionHandler_57.m_assertionInfo.capturedExpression.m_size = 0x200000000;
  local_178._8_8_ =
       ranges::chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
       size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x25f;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x26;
  capturedExpression_48.m_start = "4., WithinRel( subsection1.F()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_48,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_48,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4010000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x260;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x26;
  capturedExpression_49.m_start = "6., WithinRel( subsection1.F()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_49,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_49,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4018000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x261;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x27;
  capturedExpression_50.m_start = "10., WithinRel( subsection1.F()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_50,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_50,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4024000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x262;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x27;
  capturedExpression_51.m_start = "12., WithinRel( subsection1.F()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_51,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_51,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4028000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x263;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x32;
  capturedExpression_52.m_start = "4., WithinRel( subsection1.probabilities()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_52,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_52,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4010000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x264;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x32;
  capturedExpression_53.m_start = "6., WithinRel( subsection1.probabilities()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_53,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_53,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4018000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x265;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x33;
  capturedExpression_54.m_start = "10., WithinRel( subsection1.probabilities()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_54,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_54,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4024000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  pIVar3 = local_88;
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  catchAssertionHandler_57.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/6/ContinuumEnergyAngle/test/ContinuumEnergyAngle.test.cpp"
  ;
  catchAssertionHandler_57.m_assertionInfo.macroName.m_size = 0x266;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x33;
  capturedExpression_55.m_start = "12., WithinRel( subsection1.probabilities()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&subsection2,macroName_55,
             (SourceLineInfo *)&catchAssertionHandler_57,capturedExpression_55,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4028000000000000;
  local_178._M_allocated_capacity =
       subsection1.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_180._M_current = (double *)&subsection1.super_Base.super_ListRecord.data;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_b8,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_190,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)&catchAssertionHandler_57,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)&catchAssertionHandler_57,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = &catchAssertionHandler_57;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&subsection2,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase
            ((MatcherUntypedBase *)&catchAssertionHandler_57);
  Catch::AssertionHandler::complete((AssertionHandler *)&subsection2);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&subsection2);
  pvVar6 = std::
           get<3ul,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>
                     ((pIVar3->sequence_).
                      super__Vector_base<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>,_std::allocator<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution::TabulatedDistribution
            (&subsection2,pvVar6);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x269;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x22;
  capturedExpression_56.m_start = "2e+7, WithinRel( subsection2.E() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_56,(SourceLineInfo *)local_190,
             capturedExpression_56,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_190,
             subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26a;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x2f;
  capturedExpression_57.m_start = "2e+7, WithinRel( subsection2.incidentEnergy() )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_57,(SourceLineInfo *)local_190,
             capturedExpression_57,ContinueOnFailure);
  local_100._0_8_ = (_func_int **)0x417312d000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_190,
             subsection2.super_Base.super_ListRecord.metadata.fields.
             super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
             super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
             super__Head_base<1UL,_double,_false>._M_head_impl);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)local_100);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)local_100;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26b;
  macroName_58.m_size = 5;
  macroName_58.m_start = "CHECK";
  capturedExpression_58.m_size = 0x18;
  capturedExpression_58.m_start = "14 == subsection2.LANG()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_58,(SourceLineInfo *)local_190,
             capturedExpression_58,ContinueOnFailure);
  local_188._1_1_ = subsection2.lang_ == 0xe;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed330;
  local_188._4_4_ = 0xe;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_4_ = subsection2.lang_;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26c;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x15;
  capturedExpression_59.m_start = "0 == subsection2.ND()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_59,(SourceLineInfo *)local_190,
             capturedExpression_59,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl == 0;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188 = local_188 & 0xffffffff;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26d;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x29;
  capturedExpression_60.m_start = "0 == subsection2.numberDiscreteEnergies()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_60,(SourceLineInfo *)local_190,
             capturedExpression_60,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl == 0;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188 = local_188 & 0xffffffff;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
       _M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26e;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x15;
  capturedExpression_61.m_start = "4 == subsection2.NA()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_61,(SourceLineInfo *)local_190,
             capturedExpression_61,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl == 4;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 4;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x26f;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x2a;
  capturedExpression_62.m_start = "4 == subsection2.numberAngularParameters()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_62,(SourceLineInfo *)local_190,
             capturedExpression_62,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl == 4;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 4;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x270;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x16;
  capturedExpression_63.m_start = "12 == subsection2.NW()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_63,(SourceLineInfo *)local_190,
             capturedExpression_63,ContinueOnFailure);
  local_178._8_8_ =
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start >> 3;
  local_188._1_1_ =
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_finish -
       (long)subsection2.super_Base.super_ListRecord.data.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start == 0x60;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 0xc;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x271;
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  capturedExpression_64.m_size = 0x16;
  capturedExpression_64.m_start = "2 == subsection2.NEP()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_64,(SourceLineInfo *)local_190,
             capturedExpression_64,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x272;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0x2a;
  capturedExpression_65.m_start = "2 == subsection2.numberSecondaryEnergies()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_65,(SourceLineInfo *)local_190,
             capturedExpression_65,ContinueOnFailure);
  local_188._1_1_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  local_178._8_8_ =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x273;
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  capturedExpression_66.m_size = 0x1c;
  capturedExpression_66.m_start = "2 == subsection2.EP().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_66,(SourceLineInfo *)local_190,
             capturedExpression_66,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection2.super_Base);
  plVar2 = (long *)CONCAT44(uStack_ac,CONCAT22(uStack_ae,CONCAT11(bStack_af,local_b0)));
  local_178._8_8_ =
       (((long)local_a8._M_head_impl._M_current + (plVar2[1] - *plVar2 >> 3)) - 1U) /
       (ulong)local_a8._M_head_impl._M_current;
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x274;
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  capturedExpression_67.m_size = 0x22;
  capturedExpression_67.m_start = "2 == subsection2.energies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_67,(SourceLineInfo *)local_190,
             capturedExpression_67,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_b8,&subsection2.super_Base);
  plVar2 = (long *)CONCAT44(uStack_ac,CONCAT22(uStack_ae,CONCAT11(bStack_af,local_b0)));
  local_178._8_8_ =
       (((long)local_a8._M_head_impl._M_current + (plVar2[1] - *plVar2 >> 3)) - 1U) /
       (ulong)local_a8._M_head_impl._M_current;
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x275;
  macroName_68.m_size = 10;
  macroName_68.m_start = "CHECK_THAT";
  capturedExpression_68.m_size = 0x25;
  capturedExpression_68.m_start = "13., WithinRel( subsection2.EP()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_68,(SourceLineInfo *)local_190,
             capturedExpression_68,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x402a000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_100,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x276;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x25;
  capturedExpression_69.m_start = "19., WithinRel( subsection2.EP()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_69,(SourceLineInfo *)local_190,
             capturedExpression_69,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4033000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_100,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x277;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x2b;
  capturedExpression_70.m_start = "13., WithinRel( subsection2.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_70,(SourceLineInfo *)local_190,
             capturedExpression_70,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x402a000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_100,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x278;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x2b;
  capturedExpression_71.m_start = "19., WithinRel( subsection2.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_71,(SourceLineInfo *)local_190,
             capturedExpression_71,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4033000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::EP
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::ref_view<const_std::vector<double>_>,_long>
              *)local_100,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  bStack_af = Catch::Matchers::WithinRelMatcher::match
                        ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3f0;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_a0 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x279;
  macroName_72.m_size = 5;
  macroName_72.m_start = "CHECK";
  capturedExpression_72.m_size = 0x1c;
  capturedExpression_72.m_start = "2 == subsection2.F0().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_72,(SourceLineInfo *)local_190,
             capturedExpression_72,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  local_178._8_8_ =
       (ulong)((long)local_a0 +
              (CONCAT44(uStack_ac,CONCAT22(uStack_ae,CONCAT11(bStack_af,local_b0))) -
               (long)local_a8._M_head_impl._M_current >> 3) + -1) / (ulong)local_a0;
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27a;
  macroName_73.m_size = 5;
  macroName_73.m_start = "CHECK";
  capturedExpression_73.m_size = 0x34;
  capturedExpression_73.m_start = "2 == subsection2.totalEmissionProbabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_73,(SourceLineInfo *)local_190,
             capturedExpression_73,ContinueOnFailure);
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  local_178._8_8_ =
       (ulong)((long)local_a0 +
              (CONCAT44(uStack_ac,CONCAT22(uStack_ae,CONCAT11(bStack_af,local_b0))) -
               (long)local_a8._M_head_impl._M_current >> 3) + -1) / (ulong)local_a0;
  local_188._1_1_ = local_178._8_8_ == 2;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  local_188._4_4_ = 2;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27b;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x25;
  capturedExpression_74.m_start = "14., WithinRel( subsection2.F0()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_74,(SourceLineInfo *)local_190,
             capturedExpression_74,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x402c000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27c;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x25;
  capturedExpression_75.m_start = "20., WithinRel( subsection2.F0()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_75,(SourceLineInfo *)local_190,
             capturedExpression_75,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27d;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x3d;
  capturedExpression_76.m_start = "14., WithinRel( subsection2.totalEmissionProbabilities()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_76,(SourceLineInfo *)local_190,
             capturedExpression_76,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x402c000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27e;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x3d;
  capturedExpression_77.m_start = "20., WithinRel( subsection2.totalEmissionProbabilities()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_77,(SourceLineInfo *)local_190,
             capturedExpression_77,ContinueOnFailure);
  local_d8._vptr_ITransientExpression = (_func_int **)0x4034000000000000;
  njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::Base::F0
            ((invoke_result_t<ranges::views::stride_base_fn,_ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_long>
              *)local_b8,&subsection2.super_Base);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_b8,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_f7 = Catch::Matchers::WithinRelMatcher::match
                       ((WithinRelMatcher *)local_190,(double *)&local_d8);
  local_100[8] = true;
  local_100._0_8_ = &PTR_streamReconstructedExpression_001ed3f0;
  local_f0._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)&local_d8;
  local_e8 = (AssertionHandler *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_100);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_100);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x27f;
  macroName_78.m_size = 5;
  macroName_78.m_start = "CHECK";
  capturedExpression_78.m_size = 0x1c;
  capturedExpression_78.m_start = "2 == subsection2.MU().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_78,(SourceLineInfo *)local_190,
             capturedExpression_78,ContinueOnFailure);
  this = &subsection2.super_Base.super_ListRecord.data;
  local_178._M_allocated_capacity =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  local_180._M_current = (double *)this;
  local_98 = ranges::
             chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
             size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  bStack_af = local_98 == 2;
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  uStack_ac = 2;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x199b0d;
  local_a0 = (AssertionHandler *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x280;
  macroName_79.m_size = 5;
  macroName_79.m_start = "CHECK";
  capturedExpression_79.m_size = 0x21;
  capturedExpression_79.m_start = "2 == subsection2.cosines().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_79,(SourceLineInfo *)local_190,
             capturedExpression_79,ContinueOnFailure);
  local_178._M_allocated_capacity =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_178._8_8_ = 0x200000000;
  local_168 = 4.24399158193054e-314;
  local_180._M_current = (double *)this;
  local_98 = ranges::
             chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
             size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  bStack_af = local_98 == 2;
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  uStack_ac = 2;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x199b0d;
  local_a0 = (AssertionHandler *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x281;
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  capturedExpression_80.m_size = 0x28;
  capturedExpression_80.m_start = "15., WithinRel( subsection2.MU()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_80,(SourceLineInfo *)local_190,
             capturedExpression_80,ContinueOnFailure);
  local_108 = 15.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x282;
  macroName_81.m_size = 10;
  macroName_81.m_start = "CHECK_THAT";
  capturedExpression_81.m_size = 0x28;
  capturedExpression_81.m_start = "17., WithinRel( subsection2.MU()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_81,(SourceLineInfo *)local_190,
             capturedExpression_81,ContinueOnFailure);
  local_108 = 17.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x283;
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  capturedExpression_82.m_size = 0x28;
  capturedExpression_82.m_start = "21., WithinRel( subsection2.MU()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_82,(SourceLineInfo *)local_190,
             capturedExpression_82,ContinueOnFailure);
  local_108 = 21.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x284;
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  capturedExpression_83.m_size = 0x28;
  capturedExpression_83.m_start = "23., WithinRel( subsection2.MU()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_83,(SourceLineInfo *)local_190,
             capturedExpression_83,ContinueOnFailure);
  local_108 = 23.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x285;
  macroName_84.m_size = 10;
  macroName_84.m_start = "CHECK_THAT";
  capturedExpression_84.m_size = 0x2d;
  capturedExpression_84.m_start = "15., WithinRel( subsection2.cosines()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_84,(SourceLineInfo *)local_190,
             capturedExpression_84,ContinueOnFailure);
  local_108 = 15.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x286;
  macroName_85.m_size = 10;
  macroName_85.m_start = "CHECK_THAT";
  capturedExpression_85.m_size = 0x2d;
  capturedExpression_85.m_start = "17., WithinRel( subsection2.cosines()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_85,(SourceLineInfo *)local_190,
             capturedExpression_85,ContinueOnFailure);
  local_108 = 17.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x287;
  macroName_86.m_size = 10;
  macroName_86.m_start = "CHECK_THAT";
  capturedExpression_86.m_size = 0x2d;
  capturedExpression_86.m_start = "21., WithinRel( subsection2.cosines()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_86,(SourceLineInfo *)local_190,
             capturedExpression_86,ContinueOnFailure);
  local_108 = 21.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x288;
  macroName_87.m_size = 10;
  macroName_87.m_start = "CHECK_THAT";
  capturedExpression_87.m_size = 0x2d;
  capturedExpression_87.m_start = "23., WithinRel( subsection2.cosines()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_87,(SourceLineInfo *)local_190,
             capturedExpression_87,ContinueOnFailure);
  local_108 = 23.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x200000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x289;
  macroName_88.m_size = 5;
  macroName_88.m_start = "CHECK";
  capturedExpression_88.m_size = 0x1b;
  capturedExpression_88.m_start = "2 == subsection2.F().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_88,(SourceLineInfo *)local_190,
             capturedExpression_88,ContinueOnFailure);
  local_178._M_allocated_capacity =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  local_180._M_current = (double *)this;
  local_98 = ranges::
             chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
             size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  bStack_af = local_98 == 2;
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  uStack_ac = 2;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x199b0d;
  local_a0 = (AssertionHandler *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28a;
  macroName_89.m_size = 5;
  macroName_89.m_start = "CHECK";
  capturedExpression_89.m_size = 0x27;
  capturedExpression_89.m_start = "2 == subsection2.probabilities().size()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_89,(SourceLineInfo *)local_190,
             capturedExpression_89,ContinueOnFailure);
  local_178._M_allocated_capacity =
       subsection2.super_Base.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl + 2;
  local_178._8_8_ = 0x300000000;
  local_168 = 4.24399158193054e-314;
  local_180._M_current = (double *)this;
  local_98 = ranges::
             chunk_view_<ranges::ref_view<std::vector<double,std::allocator<double>>const>,true>::
             size<concepts::detail::CPP_true_fn(concepts::detail::Nil)>();
  bStack_af = local_98 == 2;
  local_b0 = true;
  local_b8 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed3b0;
  uStack_ac = 2;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x199b0d;
  local_a0 = (AssertionHandler *)0x2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_b8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_b8);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28b;
  macroName_90.m_size = 10;
  macroName_90.m_start = "CHECK_THAT";
  capturedExpression_90.m_size = 0x27;
  capturedExpression_90.m_start = "16., WithinRel( subsection2.F()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_90,(SourceLineInfo *)local_190,
             capturedExpression_90,ContinueOnFailure);
  local_108 = 16.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28c;
  macroName_91.m_size = 10;
  macroName_91.m_start = "CHECK_THAT";
  capturedExpression_91.m_size = 0x27;
  capturedExpression_91.m_start = "18., WithinRel( subsection2.F()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_91,(SourceLineInfo *)local_190,
             capturedExpression_91,ContinueOnFailure);
  local_108 = 18.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28d;
  macroName_92.m_size = 10;
  macroName_92.m_start = "CHECK_THAT";
  capturedExpression_92.m_size = 0x27;
  capturedExpression_92.m_start = "22., WithinRel( subsection2.F()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_92,(SourceLineInfo *)local_190,
             capturedExpression_92,ContinueOnFailure);
  local_108 = 22.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28e;
  macroName_93.m_size = 10;
  macroName_93.m_start = "CHECK_THAT";
  capturedExpression_93.m_size = 0x27;
  capturedExpression_93.m_start = "24., WithinRel( subsection2.F()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_93,(SourceLineInfo *)local_190,
             capturedExpression_93,ContinueOnFailure);
  local_108 = 24.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x28f;
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  capturedExpression_94.m_size = 0x33;
  capturedExpression_94.m_start = "16., WithinRel( subsection2.probabilities()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_94,(SourceLineInfo *)local_190,
             capturedExpression_94,ContinueOnFailure);
  local_108 = 16.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x290;
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  capturedExpression_95.m_size = 0x33;
  capturedExpression_95.m_start = "18., WithinRel( subsection2.probabilities()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_95,(SourceLineInfo *)local_190,
             capturedExpression_95,ContinueOnFailure);
  local_108 = 18.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,0);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x291;
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  capturedExpression_96.m_size = 0x33;
  capturedExpression_96.m_start = "22., WithinRel( subsection2.probabilities()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_96,(SourceLineInfo *)local_190,
             capturedExpression_96,ContinueOnFailure);
  local_108 = 22.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,0);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x292;
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  capturedExpression_97.m_size = 0x33;
  capturedExpression_97.m_start = "24., WithinRel( subsection2.probabilities()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_97,(SourceLineInfo *)local_190,
             capturedExpression_97,ContinueOnFailure);
  local_108 = 24.0;
  local_a0 = (AssertionHandler *)
             (subsection2.super_Base.super_ListRecord.metadata.fields.
              super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
              super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
              super__Tuple_impl<2UL,_long,_long,_long,_long>.
              super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
              _M_head_impl + 2);
  local_98 = 0x300000000;
  local_90 = 0x200000000;
  local_a8._M_head_impl._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)this;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((range_reference_t<D<true>_>_conflict3 *)local_100,
             (view_interface<ranges::iter_transform_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>,_ranges::indirected<ranges::views::view_closure<ranges::composed<ranges::views::view_closure<ranges::detail::bind_back_fn_<ranges::views::stride_base_fn,_int>_>,_ranges::detail::bind_back_fn_<ranges::views::drop_base_fn,_int>_>_>_>_>,_(ranges::cardinality)_1>
              *)local_b8,1);
  pdVar7 = ranges::
           view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)-1>
           ::operator[]<true,_true,_0,_0>
                     ((view_interface<ranges::stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>_>,_(ranges::cardinality)_1>
                       *)local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_190,*pdVar7);
  local_d8.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_190,&local_108);
  local_d8.m_isBinaryExpression = true;
  local_d8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001ed3f0;
  local_c8 = &local_108;
  local_c0 = (WithinRelMatcher *)local_190;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,&local_d8);
  Catch::ITransientExpression::~ITransientExpression(&local_d8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_190);
  pIVar3 = local_88;
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  local_190 = (undefined1  [8])0x1965e0;
  local_188 = (pointer)0x294;
  macroName_98.m_size = 5;
  macroName_98.m_start = "CHECK";
  capturedExpression_98.m_size = 0xf;
  capturedExpression_98.m_start = "8 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_57,macroName_98,(SourceLineInfo *)local_190,
             capturedExpression_98,ContinueOnFailure);
  local_178._8_8_ =
       njoy::ENDFtk::
       InterpolationSequenceRecord<std::variant<njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::LegendreCoefficients,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::KalbachMann,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::ThermalScatteringData,_njoy::ENDFtk::section::Type<6>::ContinuumEnergyAngle::TabulatedDistribution>_>
       ::NC(pIVar3);
  local_188._1_1_ = local_178._8_8_ == 8;
  local_188._0_1_ = true;
  local_190 = (undefined1  [8])&PTR_streamReconstructedExpression_001ed370;
  local_188._4_4_ = 8;
  local_180._M_current = (double *)0x199b0d;
  local_178._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_57,(ITransientExpression *)local_190);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_190);
  Catch::AssertionHandler::complete(&catchAssertionHandler_57);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_57);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&this->super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&subsection1.super_Base.super_ListRecord.data.
              super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void verifyChunkWithLANG14( const ContinuumEnergyAngle& chunk ) {

  CHECK( 1 == chunk.LAW() );
  CHECK( 2 == chunk.LEP() );
  CHECK( 2 == chunk.NE() );
  CHECK( 2 == chunk.numberIncidentEnergies() );
  CHECK( 1 == chunk.NR() );
  CHECK( 1 == chunk.numberInterpolationRegions() );
  CHECK( 1 == chunk.INT().size() );
  CHECK( 1 == chunk.NBT().size() );
  CHECK( 1 == chunk.INT()[0] );
  CHECK( 2 == chunk.NBT()[0] );
  CHECK( 1 == chunk.interpolants().size() );
  CHECK( 1 == chunk.boundaries().size() );
  CHECK( 1 == chunk.interpolants()[0] );
  CHECK( 2 == chunk.boundaries()[0] );

  auto energies = chunk.distributions();

  auto subsection1 = std::get< TabulatedDistribution >( energies[0] );
  CHECK_THAT( 1e-5, WithinRel( subsection1.E() ) );
  CHECK_THAT( 1e-5, WithinRel( subsection1.incidentEnergy() ) );
  CHECK( 14 == subsection1.LANG() );
  CHECK( 14 == subsection1.representation() );
  CHECK( 0 == subsection1.ND() );
  CHECK( 0 == subsection1.numberDiscreteEnergies() );
  CHECK( 4 == subsection1.NA() );
  CHECK( 4 == subsection1.numberAngularParameters() );
  CHECK( 12 == subsection1.NW() );
  CHECK( 2 == subsection1.NEP() );
  CHECK( 2 == subsection1.numberSecondaryEnergies() );
  CHECK( 2 == subsection1.EP().size() );
  CHECK( 2 == subsection1.energies().size() );
  CHECK_THAT( 1., WithinRel( subsection1.EP()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.EP()[1] ) );
  CHECK_THAT( 1., WithinRel( subsection1.energies()[0] ) );
  CHECK_THAT( 7., WithinRel( subsection1.energies()[1] ) );
  CHECK( 2 == subsection1.F0().size() );
  CHECK( 2 == subsection1.totalEmissionProbabilities().size() );
  CHECK_THAT( 2., WithinRel( subsection1.F0()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.F0()[1] ) );
  CHECK_THAT( 2., WithinRel( subsection1.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 8., WithinRel( subsection1.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection1.MU().size() );
  CHECK( 2 == subsection1.cosines().size() );
  CHECK_THAT( 3., WithinRel( subsection1.MU()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.MU()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.MU()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.MU()[1][1] ) );
  CHECK_THAT( 3., WithinRel( subsection1.cosines()[0][0] ) );
  CHECK_THAT( 5., WithinRel( subsection1.cosines()[0][1] ) );
  CHECK_THAT( 9., WithinRel( subsection1.cosines()[1][0] ) );
  CHECK_THAT( 11., WithinRel( subsection1.cosines()[1][1] ) );
  CHECK( 2 == subsection1.F().size() );
  CHECK( 2 == subsection1.probabilities().size() );
  CHECK_THAT( 4., WithinRel( subsection1.F()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.F()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.F()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.F()[1][1] ) );
  CHECK_THAT( 4., WithinRel( subsection1.probabilities()[0][0] ) );
  CHECK_THAT( 6., WithinRel( subsection1.probabilities()[0][1] ) );
  CHECK_THAT( 10., WithinRel( subsection1.probabilities()[1][0] ) );
  CHECK_THAT( 12., WithinRel( subsection1.probabilities()[1][1] ) );

  auto subsection2 = std::get< TabulatedDistribution >( energies[1] );
  CHECK_THAT( 2e+7, WithinRel( subsection2.E() ) );
  CHECK_THAT( 2e+7, WithinRel( subsection2.incidentEnergy() ) );
  CHECK( 14 == subsection2.LANG() );
  CHECK( 0 == subsection2.ND() );
  CHECK( 0 == subsection2.numberDiscreteEnergies() );
  CHECK( 4 == subsection2.NA() );
  CHECK( 4 == subsection2.numberAngularParameters() );
  CHECK( 12 == subsection2.NW() );
  CHECK( 2 == subsection2.NEP() );
  CHECK( 2 == subsection2.numberSecondaryEnergies() );
  CHECK( 2 == subsection2.EP().size() );
  CHECK( 2 == subsection2.energies().size() );
  CHECK_THAT( 13., WithinRel( subsection2.EP()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.EP()[1] ) );
  CHECK_THAT( 13., WithinRel( subsection2.energies()[0] ) );
  CHECK_THAT( 19., WithinRel( subsection2.energies()[1] ) );
  CHECK( 2 == subsection2.F0().size() );
  CHECK( 2 == subsection2.totalEmissionProbabilities().size() );
  CHECK_THAT( 14., WithinRel( subsection2.F0()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.F0()[1] ) );
  CHECK_THAT( 14., WithinRel( subsection2.totalEmissionProbabilities()[0] ) );
  CHECK_THAT( 20., WithinRel( subsection2.totalEmissionProbabilities()[1] ) );
  CHECK( 2 == subsection2.MU().size() );
  CHECK( 2 == subsection2.cosines().size() );
  CHECK_THAT( 15., WithinRel( subsection2.MU()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.MU()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.MU()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.MU()[1][1] ) );
  CHECK_THAT( 15., WithinRel( subsection2.cosines()[0][0] ) );
  CHECK_THAT( 17., WithinRel( subsection2.cosines()[0][1] ) );
  CHECK_THAT( 21., WithinRel( subsection2.cosines()[1][0] ) );
  CHECK_THAT( 23., WithinRel( subsection2.cosines()[1][1] ) );
  CHECK( 2 == subsection2.F().size() );
  CHECK( 2 == subsection2.probabilities().size() );
  CHECK_THAT( 16., WithinRel( subsection2.F()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.F()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.F()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.F()[1][1] ) );
  CHECK_THAT( 16., WithinRel( subsection2.probabilities()[0][0] ) );
  CHECK_THAT( 18., WithinRel( subsection2.probabilities()[0][1] ) );
  CHECK_THAT( 22., WithinRel( subsection2.probabilities()[1][0] ) );
  CHECK_THAT( 24., WithinRel( subsection2.probabilities()[1][1] ) );

  CHECK( 8 == chunk.NC() );
}